

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.h
# Opt level: O0

void __thiscall
chrono::utils::CSV_writer::write_to_file(CSV_writer *this,string *filename,string *header)

{
  undefined8 uVar1;
  string local_250 [48];
  ostream local_220 [8];
  ofstream ofile;
  string *header_local;
  string *filename_local;
  CSV_writer *this_local;
  
  uVar1 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_220,uVar1,0x10);
  std::operator<<(local_220,(string *)header);
  std::__cxx11::ostringstream::str();
  std::operator<<(local_220,local_250);
  std::__cxx11::string::~string(local_250);
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void write_to_file(const std::string& filename, const std::string& header = "") const {
        std::ofstream ofile(filename.c_str());
        ofile << header;
        ofile << m_ss.str();
        ofile.close();
    }